

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_ceq_h_mipsel(CPUMIPSState_conflict4 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  fpr_t *pfVar2;
  fpr_t *pfVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  sVar4 = *(short *)((long)pfVar1 + 2);
  sVar5 = *(short *)((long)pfVar1 + 4);
  sVar6 = *(short *)((long)pfVar1 + 6);
  sVar7 = *(short *)((long)pfVar1 + 8);
  sVar8 = *(short *)((long)pfVar1 + 10);
  sVar9 = *(short *)((long)pfVar1 + 0xc);
  sVar10 = *(short *)((long)pfVar1 + 0xe);
  pfVar2 = (env->active_fpu).fpr + wt;
  sVar11 = *(short *)((long)pfVar2 + 2);
  sVar12 = *(short *)((long)pfVar2 + 4);
  sVar13 = *(short *)((long)pfVar2 + 6);
  sVar14 = *(short *)((long)pfVar2 + 8);
  sVar15 = *(short *)((long)pfVar2 + 10);
  sVar16 = *(short *)((long)pfVar2 + 0xc);
  sVar17 = *(short *)((long)pfVar2 + 0xe);
  pfVar3 = (env->active_fpu).fpr + wd;
  *(ushort *)pfVar3 = -(ushort)(*(short *)pfVar2 == *(short *)pfVar1);
  *(ushort *)((long)pfVar3 + 2) = -(ushort)(sVar11 == sVar4);
  *(ushort *)((long)pfVar3 + 4) = -(ushort)(sVar12 == sVar5);
  *(ushort *)((long)pfVar3 + 6) = -(ushort)(sVar13 == sVar6);
  *(ushort *)((long)pfVar3 + 8) = -(ushort)(sVar14 == sVar7);
  *(ushort *)((long)pfVar3 + 10) = -(ushort)(sVar15 == sVar8);
  *(ushort *)((long)pfVar3 + 0xc) = -(ushort)(sVar16 == sVar9);
  *(ushort *)((long)pfVar3 + 0xe) = -(ushort)(sVar17 == sVar10);
  return;
}

Assistant:

void helper_msa_ceq_h(CPUMIPSState *env, uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_ceq_h(pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_ceq_h(pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_ceq_h(pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_ceq_h(pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_ceq_h(pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_ceq_h(pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_ceq_h(pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_ceq_h(pws->h[7],  pwt->h[7]);
}